

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

void __thiscall Corrade::Utility::StringStream::sync(StringStream *this)

{
  undefined1 *array;
  size_t size;
  long lVar1;
  char *data_00;
  _func_void_char_ptr_size_t *deleter;
  UnderlyingType UVar2;
  char *pcVar3;
  char *data;
  long in_FS_OFFSET;
  char local_39;
  Error local_38;
  
  if (*(long *)&(this->super_ostream).field_0x48 != 0) {
    array = &(this->super_ostream).field_0x48;
    Containers::arrayResize<char,Corrade::Containers::ArrayMallocAllocator<char>>
              (array,(*(long *)&(this->super_ostream).field_0x30 +
                     *(long *)&(this->super_ostream).field_0x68) -
                     *(long *)&(this->super_ostream).field_0x28);
    local_39 = '\0';
    lVar1 = *(long *)&(this->super_ostream).field_0x48;
    if (*(code **)&(this->super_ostream).field_0x58 ==
        Containers::ArrayMallocAllocator<char>::deleter) {
      pcVar3 = (char *)(*(long *)(lVar1 + -8) - 8);
    }
    else {
      pcVar3 = *(char **)&(this->super_ostream).field_0x50;
    }
    if (&local_39 + -lVar1 < pcVar3) {
      local_38.super_Debug._previousGlobalOutput = *(ostream **)(in_FS_OFFSET + -0x20);
      local_38.super_Debug._flags._value = '\0';
      local_38.super_Debug._immediateFlags._value = '\x04';
      local_38.super_Debug._internalFlags._value = '\0';
      local_38.super_Debug._sourceLocationLine = 0;
      local_38.super_Debug._sourceLocationFile = (char *)0x0;
      local_38.super_Debug._previousColor = *(Color *)(in_FS_OFFSET + -8);
      UVar2 = '\x10';
      if (*(char *)(in_FS_OFFSET + -7) == '\x01') {
        local_38.super_Debug._internalFlags._value = '\b';
        UVar2 = '\x18';
      }
      if (*(char *)(in_FS_OFFSET + -6) == '\x01') {
        local_38.super_Debug._internalFlags._value = UVar2;
      }
      local_38._previousGlobalErrorOutput = *(ostream **)(in_FS_OFFSET + -0x10);
      local_38.super_Debug._output = (ostream *)&std::cerr;
      *(undefined8 **)(in_FS_OFFSET + -0x10) = &std::cerr;
      Debug::operator<<(&local_38.super_Debug,
                        "Containers::arrayAppend(): use the list variant to append values from within the array itself"
                       );
      Error::~Error(&local_38);
      abort();
    }
    pcVar3 = Containers::Implementation::
             arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>
                       ((Array<char,_void_(*)(char_*,_unsigned_long)> *)array,1);
    *pcVar3 = local_39;
    data_00 = *(char **)&(this->super_ostream).field_0x48;
    lVar1 = *(long *)&(this->super_ostream).field_0x50;
    size = lVar1 - 1;
    *(size_t *)&(this->super_ostream).field_0x68 = size;
    pcVar3 = data_00 + lVar1 + -1;
    *(char **)&(this->super_ostream).field_0x30 = pcVar3;
    *(char **)&(this->super_ostream).field_0x28 = pcVar3;
    *(char **)&(this->super_ostream).field_0x38 = pcVar3;
    deleter = *(_func_void_char_ptr_size_t **)&(this->super_ostream).field_0x58;
    *(undefined8 *)array = 0;
    *(undefined8 *)&(this->super_ostream).field_0x50 = 0;
    *(undefined8 *)&(this->super_ostream).field_0x58 = 0;
    Containers::String::String((String *)&local_38,data_00,size,deleter);
    Containers::String::operator=(*(String **)&(this->super_ostream).field_0x60,(String *)&local_38)
    ;
    Containers::String::~String((String *)&local_38);
  }
  return;
}

Assistant:

int sync() override {
            /* If sync() gets called multiple times without any overflow() in
               between, the data are owned by the string, not the array, and
               the remaining capacity is artificially set to 0 in a setp() call
               to prevent it from being appended to. Exit early in that case as
               there's nothing left to be done. */
            if(!_data)
                return 0;

            /* Resize to just what had been written, add a null terminator at
               the end */
            /** @todo clean up once the string is capable of growing */
            arrayResize(_data, NoInit, _initialSize + pptr() - pbase());
            arrayAppend(_data, '\0');

            /* The above might have reallocated, for example when the _data had
               no space for the null terminator. Call setp() to update the
               pointers, but don't leave any extra capacity to force overflow()
               to be called for next append, which then adopts the string back
               to the array. Otherwise it would be impossible to distinguish
               whether the string was modified by the stream (causing pptr() to
               change) or from outside (causing pptr() to point to an outdated
               location). */
            _initialSize = _data.size() - 1;
            setp(_data.end() - 1, _data.end() - 1);

            /* Move the array guts back to the string, making it one byte
               smaller as the last byte is the null terminator */
            const Containers::Array<char>::Deleter deleter = _data.deleter();
            _out = Containers::String{_data.release(), _initialSize, deleter};

            return 0;
        }